

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cpp
# Opt level: O2

void __thiscall
IRBuilder::BuildReg1Unsigned1(IRBuilder *this,OpCode newOpcode,uint offset,RegSlot R0,int32 C1)

{
  undefined1 *puVar1;
  uint uVar2;
  StackSym *pSVar3;
  ValueType valueType;
  RegSlot RVar4;
  Opnd *newSrc;
  JITTimeFunctionBody *this_00;
  RegOpnd *pRVar5;
  IntConstOpnd *pIVar6;
  Instr *pIVar7;
  RegOpnd *pRVar8;
  int iVar9;
  undefined6 in_register_00000032;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_34;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_32;
  
  iVar9 = (int)CONCAT62(in_register_00000032,newOpcode);
  if (iVar9 == 0x48) {
    RVar4 = InnerScopeIndexToRegSlot(this,C1);
    pRVar8 = BuildSrcOpnd(this,RVar4,TyVar);
    pRVar5 = BuildDstOpnd(this,R0,TyVar,false,false);
    pIVar7 = IR::Instr::New(Ld_A,&pRVar5->super_Opnd,&pRVar8->super_Opnd,this->m_func);
  }
  else {
    if (iVar9 == 0xb9) {
      RVar4 = InnerScopeIndexToRegSlot(this,C1);
      pRVar5 = BuildSrcOpnd(this,RVar4,TyVar);
      pRVar8 = BuildDstOpnd(this,R0,TyVar,false,false);
      pIVar7 = IR::Instr::New(LdFrameDisplay,&pRVar8->super_Opnd,&pRVar5->super_Opnd,this->m_func);
      AddEnvOpndForInnerFrameDisplay(this,pIVar7,offset);
      uVar2 = *(uint *)&pRVar8->m_sym->field_0x18;
      if ((uVar2 & 1) != 0) {
        *(uint *)&pRVar8->m_sym->field_0x18 = uVar2 | 2;
      }
      goto LAB_004943a4;
    }
    if (iVar9 != 0xdb) {
      if (iVar9 != 0xe4) {
        if (iVar9 == 0xe2) {
          BuildRegexFromPattern(this,R0,C1,offset);
          return;
        }
        pRVar5 = BuildDstOpnd(this,R0,TyVar,false,false);
        pSVar3 = pRVar5->m_sym;
        pIVar6 = IR::IntConstOpnd::New((long)C1,TyInt32,this->m_func,false);
        pIVar7 = IR::Instr::New(newOpcode,&pRVar5->super_Opnd,&pIVar6->super_Opnd,this->m_func);
        AddInstr(this,pIVar7,offset);
        if (newOpcode == NewScopeSlots) {
          pRVar8 = IR::RegOpnd::New(this->m_func->m_localClosureSym,TyVar,this->m_func);
          pIVar7 = IR::Instr::New(Ld_A,&pRVar8->super_Opnd,&pRVar5->super_Opnd,this->m_func);
          AddInstr(this,pIVar7,0xffffffff);
        }
        uVar2 = *(uint *)&pSVar3->field_0x18;
        if ((uVar2 & 1) != 0) {
          if ((newOpcode != NewScArrayWithMissingValues) && (newOpcode != NewScArray)) {
            return;
          }
          *(uint *)&pSVar3->field_0x18 = uVar2 | 6;
        }
        if ((newOpcode == NewScArrayWithMissingValues) || (newOpcode == NewScArray)) {
          local_32.field_0 =
               (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
               ValueType::GetObject(Array);
          local_34.field_0 =
               (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
               ValueType::SetHasNoMissingValues
                         ((ValueType *)&local_32.field_0,newOpcode == NewScArray);
          valueType = ValueType::SetArrayTypeId((ValueType *)&local_34.field_0,TypeIds_Array);
          IR::Opnd::SetValueType(&pRVar5->super_Opnd,valueType);
          puVar1 = &(pRVar5->super_Opnd).field_0xb;
          *puVar1 = *puVar1 | 1;
        }
        return;
      }
      pIVar7 = IR::Instr::New(InitForInEnumerator,this->m_func);
      pRVar5 = BuildSrcOpnd(this,R0,TyVar);
      IR::Instr::SetSrc1(pIVar7,&pRVar5->super_Opnd);
      newSrc = BuildForInEnumeratorOpnd(this,C1,offset);
      IR::Instr::SetSrc2(pIVar7,newSrc);
      goto LAB_004943a4;
    }
    this_00 = Func::GetJITFunctionBody(this->m_func);
    RVar4 = JITTimeFunctionBody::GetLocalClosureReg(this_00);
    pRVar8 = BuildSrcOpnd(this,RVar4,TyVar);
    pIVar6 = IR::IntConstOpnd::New((long)C1,TyUint32,this->m_func,false);
    pRVar5 = BuildDstOpnd(this,R0,TyVar,false,false);
    pIVar7 = IR::Instr::New(GetCachedFunc,&pRVar5->super_Opnd,&pRVar8->super_Opnd,
                            &pIVar6->super_Opnd,this->m_func);
  }
  uVar2 = *(uint *)&pRVar5->m_sym->field_0x18;
  if ((uVar2 & 1) != 0) {
    *(uint *)&pRVar5->m_sym->field_0x18 = uVar2 | 2;
  }
LAB_004943a4:
  AddInstr(this,pIVar7,offset);
  return;
}

Assistant:

void
IRBuilder::BuildReg1Unsigned1(Js::OpCode newOpcode, uint offset, Js::RegSlot R0, int32 C1)
{
    switch (newOpcode)
    {
        case Js::OpCode::NewRegEx:
            this->BuildRegexFromPattern(R0, C1, offset);
            return;

        case Js::OpCode::LdInnerScope:
        {
            IR::RegOpnd * srcOpnd = BuildSrcOpnd(this->InnerScopeIndexToRegSlot(C1));
            IR::RegOpnd * dstOpnd = BuildDstOpnd(R0);
            IR::Instr * instr = IR::Instr::New(Js::OpCode::Ld_A, dstOpnd, srcOpnd, m_func);
            if (dstOpnd->m_sym->m_isSingleDef)
            {
                dstOpnd->m_sym->m_isNotNumber = true;
            }
            this->AddInstr(instr, offset);
            return;
        }

        case Js::OpCode::LdIndexedFrameDisplayNoParent:
        {
            newOpcode = Js::OpCode::LdFrameDisplay;
            IR::RegOpnd *srcOpnd = this->BuildSrcOpnd(this->InnerScopeIndexToRegSlot(C1));
            IR::RegOpnd *dstOpnd = this->BuildDstOpnd(R0);
            IR::Instr *instr = IR::Instr::New(newOpcode, dstOpnd, srcOpnd, m_func);
            this->AddEnvOpndForInnerFrameDisplay(instr, offset);
            if (dstOpnd->m_sym->m_isSingleDef)
            {
                dstOpnd->m_sym->m_isNotNumber = true;
            }
            this->AddInstr(instr, offset);
            return;
        }

        case Js::OpCode::GetCachedFunc:
        {
            IR::RegOpnd *src1Opnd = this->BuildSrcOpnd(m_func->GetJITFunctionBody()->GetLocalClosureReg());
            IR::Opnd *src2Opnd = IR::IntConstOpnd::New(C1, TyUint32, m_func);
            IR::RegOpnd *dstOpnd = this->BuildDstOpnd(R0);
            IR::Instr *instr = IR::Instr::New(newOpcode, dstOpnd, src1Opnd, src2Opnd, m_func);
            if (dstOpnd->m_sym->m_isSingleDef)
            {
                dstOpnd->m_sym->m_isNotNumber = true;
            }
            this->AddInstr(instr, offset);
            return;
        }

        case Js::OpCode::InitForInEnumerator:
        {
            IR::Instr *instr = IR::Instr::New(Js::OpCode::InitForInEnumerator, m_func);
            instr->SetSrc1(this->BuildSrcOpnd(R0));
            instr->SetSrc2(this->BuildForInEnumeratorOpnd(C1, offset));
            this->AddInstr(instr, offset);
            return;
        }
    }


    IR::RegOpnd *   dstOpnd = this->BuildDstOpnd(R0);

    StackSym *      dstSym = dstOpnd->m_sym;
    IntConstType    value = C1;
    IR::IntConstOpnd * srcOpnd = IR::IntConstOpnd::New(value, TyInt32, m_func);
    IR::Instr *     instr = IR::Instr::New(newOpcode, dstOpnd, srcOpnd, m_func);

    this->AddInstr(instr, offset);

    if (newOpcode == Js::OpCode::NewScopeSlots)
    {
        this->AddInstr(
            IR::Instr::New(
                Js::OpCode::Ld_A, IR::RegOpnd::New(m_func->GetLocalClosureSym(), TyVar, m_func), dstOpnd, m_func),
            (uint32)-1);
    }

    if (dstSym->m_isSingleDef)
    {
        switch (newOpcode)
        {
        case Js::OpCode::NewScArray:
        case Js::OpCode::NewScArrayWithMissingValues:
            dstSym->m_isSafeThis = true;
            dstSym->m_isNotNumber = true;
            break;
        }
    }

    if (newOpcode == Js::OpCode::NewScArray || newOpcode == Js::OpCode::NewScArrayWithMissingValues)
    {
        // Undefined values in array literals ([0, undefined, 1]) are treated as missing values in some versions
        dstOpnd->SetValueType(
            ValueType::GetObject(ObjectType::Array)
                .SetHasNoMissingValues(newOpcode == Js::OpCode::NewScArray)
                .SetArrayTypeId(Js::TypeIds_Array));
        dstOpnd->SetValueTypeFixed();
    }
}